

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  Vec3<float> color;
  Vec3<float> color_00;
  Vec3<float> color_01;
  Vec3<float> in_vec3;
  Mat4<float,_void> model_mat;
  char *pcVar1;
  long lVar2;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  Vec3<float> VVar3;
  Cube aCStack_d88 [8];
  undefined1 auStack_c00 [12];
  uint local_bf4;
  float *local_bf0;
  uint local_be4;
  float *local_be0;
  uint local_bd4;
  float *local_bd0;
  uint local_bc4;
  float *local_bc0;
  uint local_bb4;
  float *local_bb0;
  uint local_ba4;
  float *local_ba0;
  uint local_b94;
  float *local_b90;
  uint local_b84;
  float *local_b80;
  uint local_b74;
  float *local_b70;
  char *local_b68;
  uint local_b60;
  undefined4 local_b5c;
  undefined1 local_b58 [16];
  char *local_b48;
  uint local_b40;
  undefined4 local_b3c;
  undefined1 local_b38 [16];
  char *local_b28;
  uint local_b20;
  undefined4 local_b1c;
  undefined1 local_b18 [16];
  int local_b04;
  string_view *local_b00;
  GLuint local_af8;
  GLuint local_af4;
  Cube *local_af0;
  Cube *local_ae8;
  Cube *local_ae0;
  undefined8 local_ad8;
  Cube *local_ad0;
  basic_string_view<char,_std::char_traits<char>_> *local_ac8;
  string_view *local_ac0;
  basic_string_view<char,_std::char_traits<char>_> *local_ab8;
  string_view *local_ab0;
  basic_string_view<char,_std::char_traits<char>_> *local_aa8;
  string_view *local_aa0;
  undefined8 local_a98;
  string local_a90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a50;
  string local_a30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9f0;
  string local_9d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_990;
  undefined8 local_970;
  undefined4 local_968;
  undefined8 local_960;
  undefined4 local_958;
  undefined8 local_950;
  float local_948;
  undefined8 local_940;
  float local_938;
  undefined8 local_930;
  undefined4 local_928;
  string local_920;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_900;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8e0;
  undefined8 local_8c0;
  undefined4 local_8b8;
  undefined8 local_8b0;
  undefined4 local_8a8;
  undefined8 local_8a0;
  float local_898;
  undefined8 local_890;
  float local_888;
  undefined8 local_880;
  undefined4 local_878;
  string local_870;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_850;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_830;
  undefined8 local_810;
  undefined4 local_808;
  undefined8 local_800;
  undefined4 local_7f8;
  undefined8 local_7f0;
  float local_7e8;
  undefined8 local_7e0;
  float local_7d8;
  undefined8 local_7d0;
  undefined4 local_7c8;
  string local_7c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_780;
  undefined8 local_760;
  float local_758;
  undefined8 local_750;
  float local_748;
  string local_740;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_720;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_700;
  int local_6dc;
  undefined8 uStack_6d8;
  int i_1;
  float local_6d0;
  undefined8 local_6c8;
  float local_6c0;
  Mat4<float,_void> local_6b8;
  undefined1 local_678 [8];
  Mat4<float,_void> cube_model;
  Mat4<float,_void> view;
  Vec3<float> atten_vec [9];
  time_point then;
  time_point now;
  duration dStack_538;
  Mat4<float,_void> projection;
  Mat4<float,_void> local_470;
  Vec3<float> local_430;
  Mat4<float,_void> local_424;
  Vec3<float> local_3e4;
  Mat4<float,_void> local_3d8;
  undefined1 auStack_398 [8];
  Mat4<float,_void> inverse_model;
  Mat4<float,_void> model;
  SkyBox skybox;
  char *skybox_textures [6];
  basic_string_view<char,_std::char_traits<char>_> local_2d0;
  GLuint local_2c0;
  GLuint local_2bc;
  int zvertex;
  GLuint zprogram;
  ZRender zrender;
  float local_288;
  int local_284;
  int i;
  unsigned_long __vla_expr0;
  undefined1 local_268 [4];
  int NR_LIGHT_CUBES;
  Vec3<float> cube_colors [9];
  Vec3<float> cube_positions [9];
  undefined1 local_180 [8];
  Model floorModel;
  Model mainModel;
  basic_string_view<char,_std::char_traits<char>_> local_d0;
  ShaderProgram local_bc;
  basic_string_view<char,_std::char_traits<char>_> local_b0;
  basic_string_view<char,_std::char_traits<char>_> local_a0;
  ShaderProgram local_8c;
  basic_string_view<char,_std::char_traits<char>_> local_80;
  basic_string_view<char,_std::char_traits<char>_> local_70;
  ShaderProgram local_5c;
  undefined1 local_50 [8];
  Renderer render;
  char **argv_local;
  int argc_local;
  
  auStack_c00._0_8_ = 0x10a24e;
  render.skybox_shader_program._4_8_ = argv;
  Render::CreateRenderer((Renderer *)local_50,state.screen_width,state.screen_height);
  local_ac8 = &local_70;
  auStack_c00._0_8_ = 0x10a265;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (local_ac8,"./shader/model-vertex.glsl");
  local_ac0 = &local_80;
  auStack_c00._0_8_ = 0x10a27c;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (local_ac0,"./shader/model-fragment.glsl");
  auStack_c00._0_8_ = 0x10a293;
  ShaderProgram::ShaderProgram(&local_5c,local_ac8,local_ac0);
  render.shader_program.shader_program = local_5c.fragment_shader;
  render.vbo_offset = local_5c.shader_program;
  render.max_allocated = local_5c.vertex_shader;
  local_ab8 = &local_a0;
  auStack_c00._0_8_ = 0x10a2bb;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (local_ab8,"./shader/light-cube-vertex.glsl");
  local_ab0 = &local_b0;
  auStack_c00._0_8_ = 0x10a2d5;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (local_ab0,"./shader/light-cube-fragment.glsl");
  auStack_c00._0_8_ = 0x10a2ef;
  ShaderProgram::ShaderProgram(&local_8c,local_ab8,local_ab0);
  render.light_cube_shader_program.shader_program = local_8c.fragment_shader;
  render.shader_program.vertex_shader = local_8c.shader_program;
  render.shader_program.fragment_shader = local_8c.vertex_shader;
  local_aa8 = &local_d0;
  auStack_c00._0_8_ = 0x10a31a;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (local_aa8,"./shader/skybox-vertex.glsl");
  local_aa0 = (string_view *)((long)&mainModel.directory.field_2 + 8);
  auStack_c00._0_8_ = 0x10a334;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (local_aa0,"./shader/skybox-fragment.glsl");
  auStack_c00._0_8_ = 0x10a34e;
  ShaderProgram::ShaderProgram(&local_bc,local_aa8,local_aa0);
  render.skybox_shader_program.shader_program = local_bc.fragment_shader;
  render.light_cube_shader_program.vertex_shader = local_bc.shader_program;
  render.light_cube_shader_program.fragment_shader = local_bc.vertex_shader;
  auStack_c00._0_8_ = 0x10a36c;
  stbi_set_flip_vertically_on_load(1);
  auStack_c00._0_8_ = 0x10a37f;
  Model::Model((Model *)((long)&floorModel.directory.field_2 + 8),"./Models/Final/rocket.obj");
  auStack_c00._0_8_ = 0x10a392;
  Model::Model((Model *)local_180,"./Models/Final/Floor/floor.obj");
  auStack_c00._0_8_ = 0x10a3b8;
  FMath::Vec3<float>::Vec3
            ((Vec3<float> *)((long)&cube_colors[8].field_0 + 8),2.19173,1.93018,2.25142);
  auStack_c00._0_8_ = 0x10a3de;
  FMath::Vec3<float>::Vec3
            ((Vec3<float> *)((long)&cube_positions[0].field_0 + 4),2.15991,1.89708,-1.57857);
  auStack_c00._0_8_ = 0x10a404;
  FMath::Vec3<float>::Vec3
            ((Vec3<float> *)((long)&cube_positions[1].field_0 + 4),1.32463,5.01879,2.60398);
  auStack_c00._0_8_ = 0x10a42a;
  FMath::Vec3<float>::Vec3
            ((Vec3<float> *)((long)&cube_positions[2].field_0 + 4),-0.746886,1.90037,2.15353);
  auStack_c00._0_8_ = 0x10a450;
  FMath::Vec3<float>::Vec3
            ((Vec3<float> *)((long)&cube_positions[3].field_0 + 4),-0.705121,1.94047,-1.54101);
  auStack_c00._0_8_ = 0x10a476;
  FMath::Vec3<float>::Vec3((Vec3<float> *)((long)&cube_positions[4].field_0 + 4),6.0,0.45,-6.0);
  auStack_c00._0_8_ = 0x10a49c;
  FMath::Vec3<float>::Vec3((Vec3<float> *)((long)&cube_positions[5].field_0 + 4),-6.0,0.45,6.0);
  auStack_c00._0_8_ = 0x10a4bd;
  FMath::Vec3<float>::Vec3((Vec3<float> *)((long)&cube_positions[6].field_0 + 4),-6.0,0.45,-6.0);
  auStack_c00._0_8_ = 0x10a4de;
  FMath::Vec3<float>::Vec3((Vec3<float> *)((long)&cube_positions[7].field_0 + 4),6.0,0.45,6.0);
  auStack_c00._0_8_ = 0x10a4fa;
  FMath::Vec3<float>::Vec3((Vec3<float> *)local_268,1.0,1.0,1.0);
  auStack_c00._0_8_ = 0x10a516;
  FMath::Vec3<float>::Vec3((Vec3<float> *)((long)&cube_colors[0].field_0 + 4),0.0,0.2,0.0);
  auStack_c00._0_8_ = 0x10a532;
  FMath::Vec3<float>::Vec3((Vec3<float> *)((long)&cube_colors[1].field_0 + 4),1.0,1.0,1.0);
  auStack_c00._0_8_ = 0x10a54e;
  FMath::Vec3<float>::Vec3((Vec3<float> *)((long)&cube_colors[2].field_0 + 4),1.0,0.0,0.0);
  auStack_c00._0_8_ = 0x10a56a;
  FMath::Vec3<float>::Vec3((Vec3<float> *)((long)&cube_colors[3].field_0 + 4),1.0,1.0,1.0);
  auStack_c00._0_8_ = 0x10a586;
  FMath::Vec3<float>::Vec3((Vec3<float> *)((long)&cube_colors[4].field_0 + 4),1.0,0.0,1.0);
  auStack_c00._0_8_ = 0x10a5a2;
  FMath::Vec3<float>::Vec3((Vec3<float> *)((long)&cube_colors[5].field_0 + 4),1.0,0.0,0.0);
  auStack_c00._0_8_ = 0x10a5be;
  FMath::Vec3<float>::Vec3((Vec3<float> *)((long)&cube_colors[6].field_0 + 4),0.0,0.0,1.0);
  auStack_c00._0_8_ = 0x10a5da;
  FMath::Vec3<float>::Vec3((Vec3<float> *)((long)&cube_colors[7].field_0 + 4),1.0,1.0,0.0);
  local_ad8 = 9;
  local_ae0 = aCStack_d88;
  local_ad0 = local_ae0;
  local_ae8 = (Cube *)(auStack_c00 + 4);
  do {
    local_af0 = local_ae0;
    Cube::Cube(local_ae0);
    local_ae0 = local_af0 + 1;
  } while (local_ae0 != local_ae8);
  for (local_284 = 0; local_284 < 9; local_284 = local_284 + 1) {
    lVar2 = (long)local_284;
    local_ad0[lVar2].position.field_0.field_0.b = cube_positions[lVar2].field_0.field_0.r;
    *(undefined8 *)&local_ad0[lVar2].position.field_0 =
         *(undefined8 *)((long)&cube_colors[lVar2 + 8].field_0 + 8);
    FMath::Vec3<float>::Vec3((Vec3<float> *)&zrender.colorFBO,0.08,0.08,0.08);
    *(undefined8 *)&local_ad0[local_284].scale.field_0 = zrender._32_8_;
    local_ad0[local_284].scale.field_0.field_0.b = local_288;
    *(undefined8 *)&local_ad0[local_284].color.field_0 =
         *(undefined8 *)(local_268 + (long)local_284 * 0xc);
    local_ad0[local_284].color.field_0.field_0.b = cube_colors[local_284].field_0.field_0.r;
  }
  Render::ZRender::ZRender((ZRender *)&zvertex,state.screen_width,state.screen_height);
  local_af4 = (*glad_glCreateProgram)();
  local_b00 = &local_2d0;
  local_2bc = local_af4;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (local_b00,"./shader/zvertex.glsl");
  local_af8 = CompileAndLogShader(local_b00,0x8b31);
  local_2c0 = local_af8;
  (*glad_glAttachShader)(local_2bc,local_af8);
  Render::ZRender::attachDepthFragment((ZRender *)&zvertex,local_2bc);
  skybox._8_8_ = anon_var_dwarf_398a;
  SkyBox::SkyBox((SkyBox *)(model.elements[3] + 2));
  SkyBox::load_skybox_textures((SkyBox *)(model.elements[3] + 2),(char **)&skybox.texture_ID);
  (*glad_glUseProgram)(render.light_cube_shader_program.vertex_shader);
  update_uniform_1i("skybox",render.light_cube_shader_program.vertex_shader,0);
  FMath::Mat4<float,_void>::Mat4((Mat4<float,_void> *)(inverse_model.elements[3] + 2),1.0);
  FMath::Mat4<float,_void>::Mat4((Mat4<float,_void> *)auStack_398,1.0);
  FMath::Vec3<float>::Vec3(&local_3e4,0.0,0.0,0.0);
  FMath::Mat4<float,_void>::translate
            (&local_3d8,(Mat4<float,_void> *)(inverse_model.elements[3] + 2),&local_3e4);
  model.elements[2][2] = local_3d8.elements[3][0];
  model.elements[2][3] = local_3d8.elements[3][1];
  model.elements[3][0] = local_3d8.elements[3][2];
  model.elements[3][1] = local_3d8.elements[3][3];
  model.elements[1][2] = local_3d8.elements[2][0];
  model.elements[1][3] = local_3d8.elements[2][1];
  model.elements[2][0] = local_3d8.elements[2][2];
  model.elements[2][1] = local_3d8.elements[2][3];
  model.elements[0][2] = local_3d8.elements[1][0];
  model.elements[0][3] = local_3d8.elements[1][1];
  model.elements[1][0] = local_3d8.elements[1][2];
  model.elements[1][1] = local_3d8.elements[1][3];
  inverse_model.elements[3][2] = local_3d8.elements[0][0];
  inverse_model.elements[3][3] = local_3d8.elements[0][1];
  model.elements[0][0] = local_3d8.elements[0][2];
  model.elements[0][1] = local_3d8.elements[0][3];
  FMath::Vec3<float>::Vec3(&local_430,0.2,0.2,0.2);
  FMath::Mat4<float,_void>::scale
            (&local_424,(Mat4<float,_void> *)(inverse_model.elements[3] + 2),&local_430);
  model.elements[2][2] = local_424.elements[3][0];
  model.elements[2][3] = local_424.elements[3][1];
  model.elements[3][0] = local_424.elements[3][2];
  model.elements[3][1] = local_424.elements[3][3];
  model.elements[1][2] = local_424.elements[2][0];
  model.elements[1][3] = local_424.elements[2][1];
  model.elements[2][0] = local_424.elements[2][2];
  model.elements[2][1] = local_424.elements[2][3];
  model.elements[0][2] = local_424.elements[1][0];
  model.elements[0][3] = local_424.elements[1][1];
  model.elements[1][0] = local_424.elements[1][2];
  model.elements[1][1] = local_424.elements[1][3];
  inverse_model.elements[3][2] = local_424.elements[0][0];
  inverse_model.elements[3][3] = local_424.elements[0][1];
  model.elements[0][0] = local_424.elements[0][2];
  model.elements[0][1] = local_424.elements[0][3];
  model_mat.elements[0][2] = local_424.elements[0][2];
  model_mat.elements[0][3] = local_424.elements[0][3];
  model_mat.elements[0][0] = local_424.elements[0][0];
  model_mat.elements[0][1] = local_424.elements[0][1];
  model_mat.elements[1][0] = local_424.elements[1][0];
  model_mat.elements[1][1] = local_424.elements[1][1];
  model_mat.elements[1][2] = local_424.elements[1][2];
  model_mat.elements[1][3] = local_424.elements[1][3];
  model_mat.elements[2][0] = local_424.elements[2][0];
  model_mat.elements[2][1] = local_424.elements[2][1];
  model_mat.elements[2][2] = local_424.elements[2][2];
  model_mat.elements[2][3] = local_424.elements[2][3];
  model_mat.elements[3][0] = local_424.elements[3][0];
  model_mat.elements[3][1] = local_424.elements[3][1];
  model_mat.elements[3][2] = local_424.elements[3][2];
  model_mat.elements[3][3] = local_424.elements[3][3];
  FMath::Mat4<float,_void>::model_mat_inverse(&local_470,(Mat4<float,_void> *)auStack_398,model_mat)
  ;
  inverse_model.elements[2][2] = local_470.elements[3][0];
  inverse_model.elements[2][3] = local_470.elements[3][1];
  inverse_model.elements[3][0] = local_470.elements[3][2];
  inverse_model.elements[3][1] = local_470.elements[3][3];
  inverse_model.elements[1][2] = local_470.elements[2][0];
  inverse_model.elements[1][3] = local_470.elements[2][1];
  inverse_model.elements[2][0] = local_470.elements[2][2];
  inverse_model.elements[2][1] = local_470.elements[2][3];
  inverse_model.elements[0][2] = local_470.elements[1][0];
  inverse_model.elements[0][3] = local_470.elements[1][1];
  inverse_model.elements[1][0] = local_470.elements[1][2];
  inverse_model.elements[1][1] = local_470.elements[1][3];
  auStack_398._0_4_ = local_470.elements[0][0];
  auStack_398._4_4_ = local_470.elements[0][1];
  inverse_model.elements[0][0] = local_470.elements[0][2];
  inverse_model.elements[0][1] = local_470.elements[0][3];
  FMath::Mat4<float,_void>::transpose
            ((Mat4<float,_void> *)(projection.elements[3] + 2),(Mat4<float,_void> *)auStack_398);
  auStack_398._0_4_ = projection.elements[3][2];
  auStack_398._4_4_ = projection.elements[3][3];
  FMath::Mat4<float,_void>::Mat4((Mat4<float,_void> *)&dStack_538,1.0);
  FMath::Mat4<float,_void>::perspective
            ((Mat4<float,_void> *)&now,(Mat4<float,_void> *)&dStack_538,1.0,30.0,0.01,100.0);
  dStack_538 = now.__d.__r;
  (*glad_glEnable)(0xb44);
  register0x00000000 = std::chrono::_V2::steady_clock::now();
  FMath::Vec3<float>::Vec3((Vec3<float> *)(view.elements[3] + 2),1.0,0.44,0.35);
  FMath::Vec3<float>::Vec3((Vec3<float> *)((long)&atten_vec[0].field_0 + 4),1.0,0.44,0.35);
  FMath::Vec3<float>::Vec3((Vec3<float> *)((long)&atten_vec[1].field_0 + 4),1.0,0.44,0.35);
  FMath::Vec3<float>::Vec3((Vec3<float> *)((long)&atten_vec[2].field_0 + 4),1.0,0.44,0.35);
  FMath::Vec3<float>::Vec3((Vec3<float> *)((long)&atten_vec[3].field_0 + 4),1.0,0.44,0.35);
  FMath::Vec3<float>::Vec3((Vec3<float> *)((long)&atten_vec[4].field_0 + 4),0.1,0.1,0.1);
  FMath::Vec3<float>::Vec3((Vec3<float> *)((long)&atten_vec[5].field_0 + 4),0.1,0.1,0.1);
  FMath::Vec3<float>::Vec3((Vec3<float> *)((long)&atten_vec[6].field_0 + 4),0.1,0.1,0.1);
  FMath::Vec3<float>::Vec3((Vec3<float> *)((long)&atten_vec[7].field_0 + 4),0.1,0.1,0.1);
  while (local_b04 = glfwWindowShouldClose((GLFWwindow *)local_50), local_b04 == 0) {
    Render::ZRender::clearBG((ZRender *)&zvertex,0.25,0.25,0.25,1.0);
    Render::ZRender::clearDepth((ZRender *)&zvertex);
    (*glad_glUseProgram)(render.vbo_offset);
    FMath::Mat4<float,_void>::Mat4((Mat4<float,_void> *)(cube_model.elements[3] + 2),1.0);
    FMath::Mat4<float,_void>::Mat4((Mat4<float,_void> *)local_678,1.0);
    Camera::ViewMatrix(&local_6b8,&state.camera);
    view.elements[2][2] = local_6b8.elements[3][0];
    view.elements[2][3] = local_6b8.elements[3][1];
    view.elements[3][0] = local_6b8.elements[3][2];
    view.elements[3][1] = local_6b8.elements[3][3];
    view.elements[1][2] = local_6b8.elements[2][0];
    view.elements[1][3] = local_6b8.elements[2][1];
    view.elements[2][0] = local_6b8.elements[2][2];
    view.elements[2][1] = local_6b8.elements[2][3];
    view.elements[0][2] = local_6b8.elements[1][0];
    view.elements[0][3] = local_6b8.elements[1][1];
    view.elements[1][0] = local_6b8.elements[1][2];
    view.elements[1][1] = local_6b8.elements[1][3];
    cube_model.elements[3][2] = local_6b8.elements[0][0];
    cube_model.elements[3][3] = local_6b8.elements[0][1];
    view.elements[0][0] = local_6b8.elements[0][2];
    view.elements[0][1] = local_6b8.elements[0][3];
    local_6c0 = state.camera.camera_pos.field_0.field_0.b;
    local_6c8 = state.camera.camera_pos.field_0._0_8_;
    local_6d0 = state.camera.camera_pos.field_0.field_0.b;
    uStack_6d8 = state.camera.camera_pos.field_0._0_8_;
    VVar3.field_0.field_0.b = state.camera.camera_pos.field_0.field_0.b;
    VVar3.field_0._0_8_ = state.camera.camera_pos.field_0._0_8_;
    update_uniform_3f("viewPos",render.vbo_offset,VVar3);
    for (local_6dc = 0; local_6dc < 9; local_6dc = local_6dc + 1) {
      std::__cxx11::to_string(&local_740,local_6dc);
      std::operator+(&local_720,"light[",&local_740);
      std::operator+(&local_700,&local_720,"].position");
      pcVar1 = (char *)std::__cxx11::string::c_str();
      local_758 = local_ad0[local_6dc].position.field_0.field_0.b;
      local_760 = *(undefined8 *)&local_ad0[local_6dc].position.field_0;
      in_vec3.field_0.field_0.b = local_758;
      in_vec3.field_0._0_8_ = local_760;
      local_750 = local_760;
      local_748 = local_758;
      update_uniform_3f(pcVar1,render.vbo_offset,in_vec3);
      std::__cxx11::string::~string((string *)&local_700);
      std::__cxx11::string::~string((string *)&local_720);
      std::__cxx11::string::~string((string *)&local_740);
      std::__cxx11::to_string(&local_7c0,local_6dc);
      std::operator+(&local_7a0,"light[",&local_7c0);
      std::operator+(&local_780,&local_7a0,"].ambient");
      local_b28 = (char *)std::__cxx11::string::c_str();
      local_b20 = render.vbo_offset;
      local_7e8 = local_ad0[local_6dc].color.field_0.field_0.b;
      local_7f0 = *(undefined8 *)&local_ad0[local_6dc].color.field_0;
      color_01.field_0.field_0.b = local_7e8;
      color_01.field_0._0_8_ = local_7f0;
      local_7e0 = local_7f0;
      local_7d8 = local_7e8;
      VVar3 = ambient(color_01);
      local_b1c = VVar3.field_0._8_4_;
      local_810 = VVar3.field_0._0_8_;
      local_b18._8_4_ = extraout_XMM0_Dc;
      local_b18._0_8_ = local_810;
      local_b18._12_4_ = extraout_XMM0_Dd;
      local_808 = local_b1c;
      local_800 = local_810;
      local_7f8 = local_b1c;
      local_7d0 = local_810;
      local_7c8 = local_b1c;
      update_uniform_3f(local_b28,local_b20,VVar3);
      std::__cxx11::string::~string((string *)&local_780);
      std::__cxx11::string::~string((string *)&local_7a0);
      std::__cxx11::string::~string((string *)&local_7c0);
      std::__cxx11::to_string(&local_870,local_6dc);
      std::operator+(&local_850,"light[",&local_870);
      std::operator+(&local_830,&local_850,"].diffuse");
      local_b48 = (char *)std::__cxx11::string::c_str();
      local_b40 = render.vbo_offset;
      local_898 = local_ad0[local_6dc].color.field_0.field_0.b;
      local_8a0 = *(undefined8 *)&local_ad0[local_6dc].color.field_0;
      color_00.field_0.field_0.b = local_898;
      color_00.field_0._0_8_ = local_8a0;
      local_890 = local_8a0;
      local_888 = local_898;
      VVar3 = diffuse(color_00);
      local_b3c = VVar3.field_0._8_4_;
      local_8c0 = VVar3.field_0._0_8_;
      local_b38._8_4_ = extraout_XMM0_Dc_00;
      local_b38._0_8_ = local_8c0;
      local_b38._12_4_ = extraout_XMM0_Dd_00;
      local_8b8 = local_b3c;
      local_8b0 = local_8c0;
      local_8a8 = local_b3c;
      local_880 = local_8c0;
      local_878 = local_b3c;
      update_uniform_3f(local_b48,local_b40,VVar3);
      std::__cxx11::string::~string((string *)&local_830);
      std::__cxx11::string::~string((string *)&local_850);
      std::__cxx11::string::~string((string *)&local_870);
      std::__cxx11::to_string(&local_920,local_6dc);
      std::operator+(&local_900,"light[",&local_920);
      std::operator+(&local_8e0,&local_900,"].specular");
      local_b68 = (char *)std::__cxx11::string::c_str();
      local_b60 = render.vbo_offset;
      local_948 = local_ad0[local_6dc].color.field_0.field_0.b;
      local_950 = *(undefined8 *)&local_ad0[local_6dc].color.field_0;
      color.field_0.field_0.b = local_948;
      color.field_0._0_8_ = local_950;
      local_940 = local_950;
      local_938 = local_948;
      VVar3 = specular(color);
      local_b5c = VVar3.field_0._8_4_;
      local_970 = VVar3.field_0._0_8_;
      local_b58._8_4_ = extraout_XMM0_Dc_01;
      local_b58._0_8_ = local_970;
      local_b58._12_4_ = extraout_XMM0_Dd_01;
      local_968 = local_b5c;
      local_960 = local_970;
      local_958 = local_b5c;
      local_930 = local_970;
      local_928 = local_b5c;
      update_uniform_3f(local_b68,local_b60,VVar3);
      std::__cxx11::string::~string((string *)&local_8e0);
      std::__cxx11::string::~string((string *)&local_900);
      std::__cxx11::string::~string((string *)&local_920);
      std::__cxx11::to_string(&local_9d0,local_6dc);
      std::operator+(&local_9b0,"light[",&local_9d0);
      std::operator+(&local_990,&local_9b0,"].constantAtten");
      pcVar1 = (char *)std::__cxx11::string::c_str();
      update_uniform_1f(pcVar1,render.vbo_offset,atten_vec[(long)local_6dc + -1].field_0.field_0.g);
      std::__cxx11::string::~string((string *)&local_990);
      std::__cxx11::string::~string((string *)&local_9b0);
      std::__cxx11::string::~string((string *)&local_9d0);
      std::__cxx11::to_string(&local_a30,local_6dc);
      std::operator+(&local_a10,"light[",&local_a30);
      std::operator+(&local_9f0,&local_a10,"].linearAtten");
      pcVar1 = (char *)std::__cxx11::string::c_str();
      update_uniform_1f(pcVar1,render.vbo_offset,atten_vec[(long)local_6dc + -1].field_0.field_0.b);
      std::__cxx11::string::~string((string *)&local_9f0);
      std::__cxx11::string::~string((string *)&local_a10);
      std::__cxx11::string::~string((string *)&local_a30);
      std::__cxx11::to_string(&local_a90,local_6dc);
      std::operator+(&local_a70,"light[",&local_a90);
      std::operator+(&local_a50,&local_a70,"].quadraticAtten");
      pcVar1 = (char *)std::__cxx11::string::c_str();
      update_uniform_1f(pcVar1,render.vbo_offset,atten_vec[local_6dc].field_0.field_0.r);
      std::__cxx11::string::~string((string *)&local_a50);
      std::__cxx11::string::~string((string *)&local_a70);
      std::__cxx11::string::~string((string *)&local_a90);
    }
    (*glad_glUseProgram)(render.vbo_offset);
    local_b74 = render.vbo_offset;
    local_b70 = FMath::Mat4<float,_void>::operator[]
                          ((Mat4<float,_void> *)(inverse_model.elements[3] + 2),0);
    update_uniform_matrix_4f("model",local_b74,local_b70);
    local_b84 = render.vbo_offset;
    local_b80 = FMath::Mat4<float,_void>::operator[]((Mat4<float,_void> *)auStack_398,0);
    update_uniform_matrix_4f("inv_model",local_b84,local_b80);
    local_b94 = render.vbo_offset;
    local_b90 = FMath::Mat4<float,_void>::value_ptr((Mat4<float,_void> *)&dStack_538);
    update_uniform_matrix_4f("projection",local_b94,local_b90);
    local_ba4 = render.vbo_offset;
    local_ba0 = FMath::Mat4<float,_void>::operator[]
                          ((Mat4<float,_void> *)(cube_model.elements[3] + 2),0);
    update_uniform_matrix_4f("view",local_ba4,local_ba0);
    (*glad_glUseProgram)(local_2bc);
    local_bb4 = local_2bc;
    local_bb0 = FMath::Mat4<float,_void>::value_ptr
                          ((Mat4<float,_void> *)(inverse_model.elements[3] + 2));
    update_uniform_matrix_4f("model",local_bb4,local_bb0);
    local_bc4 = local_2bc;
    local_bc0 = FMath::Mat4<float,_void>::value_ptr((Mat4<float,_void> *)&dStack_538);
    update_uniform_matrix_4f("projection",local_bc4,local_bc0);
    local_bd4 = local_2bc;
    local_bd0 = FMath::Mat4<float,_void>::value_ptr
                          ((Mat4<float,_void> *)(cube_model.elements[3] + 2));
    update_uniform_matrix_4f("view",local_bd4,local_bd0);
    (*glad_glUseProgram)(render.light_cube_shader_program.vertex_shader);
    local_be4 = render.light_cube_shader_program.vertex_shader;
    local_be0 = FMath::Mat4<float,_void>::operator[]((Mat4<float,_void> *)&dStack_538,0);
    update_uniform_matrix_4f("projection",local_be4,local_be0);
    local_bf4 = render.light_cube_shader_program.vertex_shader;
    local_bf0 = FMath::Mat4<float,_void>::operator[]
                          ((Mat4<float,_void> *)(cube_model.elements[3] + 2),0);
    update_uniform_matrix_4f("view",local_bf4,local_bf0);
    (*glad_glBindFramebuffer)(0x8d40,zrender.colorBuffer);
    SkyBox::draw_skybox((SkyBox *)(model.elements[3] + 2));
    (*glad_glUseProgram)(local_2bc);
    Render::ZRender::clearDepth((ZRender *)&zvertex);
    Model::draw_model((Model *)((long)&floorModel.directory.field_2 + 8),render.vbo_offset,local_2bc
                      ,(ZRender *)&zvertex);
    Model::draw_model((Model *)local_180,render.vbo_offset,local_2bc,(ZRender *)&zvertex);
    Render::ZRender::draw((ZRender *)&zvertex);
    handleEvents((GLFWwindow *)local_50);
    local_a98 = std::chrono::_V2::steady_clock::now();
    unique0x10002ebf = local_a98;
    glfwPollEvents();
    glfwSwapBuffers((GLFWwindow *)local_50);
  }
  (*glad_glDeleteProgram)(render.vbo_offset);
  (*glad_glDeleteProgram)(render.shader_program.vertex_shader);
  (*glad_glDeleteProgram)(render.light_cube_shader_program.vertex_shader);
  Render::DestroyRenderer((Renderer *)local_50);
  auStack_c00._0_8_ = 0x10bb26;
  Model::~Model((Model *)local_180);
  auStack_c00._0_8_ = 0x10bb32;
  Model::~Model((Model *)((long)&floorModel.directory.field_2 + 8));
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
  auto render = Render::CreateRenderer(state.screen_width,state.screen_height);
  render.shader_program = ShaderProgram("./shader/model-vertex.glsl", "./shader/model-fragment.glsl");
  
  render.light_cube_shader_program = ShaderProgram("./shader/light-cube-vertex.glsl","./shader/light-cube-fragment.glsl");
  render.skybox_shader_program = ShaderProgram("./shader/skybox-vertex.glsl","./shader/skybox-fragment.glsl");

  stbi_set_flip_vertically_on_load(true);

  //Model mainModel("./models/cyborg/cyborg.obj");
  //Model mainModel("./models/rocket/rocket.obj");
  //  Model mainModel("./Models/cubie/cubie.obj");
   Model mainModel("./Models/Final/rocket.obj");
  //Model mainModel("./models/backpack/backpack.obj");
   Model floorModel("./Models/Final/Floor/floor.obj");
  
  FMath::Vec3<float> cube_positions[] = {
      //FMath::Vec3(0.6964f,  1.666f, 0.706876f),
      //FMath::Vec3(1.06075f, 1.01993f, -0.6604f),
      //FMath::Vec3(1.1641f, 1.01472f, 1.03914f),


      FMath::Vec3(2.19173f, 1.93018f, 2.25142f),
      FMath::Vec3(2.15991f, 1.89708f, -1.57857f),
      FMath::Vec3(1.32463f, 5.01879f, 2.60398f),
      FMath::Vec3(-0.746886f, 1.90037f, 2.15353f),
      FMath::Vec3(-0.705121f, 1.94047f, -1.54101f),

      // Lighting for four corners
      FMath::Vec3(6.0f,0.45f,-6.0f),
      FMath::Vec3(-6.0f,0.45f,6.0f),
      FMath::Vec3(-6.0f,0.45f,-6.0f),
      FMath::Vec3(6.0f,0.45f,6.0f),
  };

  
  FMath::Vec3<float> cube_colors[] = {
      //FMath::Vec3(1.0f, 1.0f, 1.0f),
      //FMath::Vec3(0.498f, 1.000f, 0.831f),
      //FMath::Vec3(0.863f, 0.078f, 0.235f),
      //FMath::Vec3(1.000f, 0.843f, 0.000f),
      
      FMath::Vec3(1.0f, 1.0f, 1.0f),
      FMath::Vec3(0.0f, 0.2f, 0.0f),
      FMath::Vec3(1.0f, 1.0f, 1.0f),
      FMath::Vec3(1.0f, 0.0f, 0.0f),
      FMath::Vec3(1.0f, 1.0f, 1.0f),

      FMath::Vec3(1.0f,0.0f,1.0f),
      FMath::Vec3(1.0f,0.0f,0.0f),
      FMath::Vec3(0.0f,0.0f,1.0f),
      FMath::Vec3(1.0f,1.0f,0.0f)
  };
  int NR_LIGHT_CUBES = sizeof(cube_positions) / (3 * sizeof(float));

  Cube cubes[NR_LIGHT_CUBES];
  for (int i = 0; i < NR_LIGHT_CUBES; i++){
    cubes[i].position = cube_positions[i];
    cubes[i].scale = FMath::Vec3<float>(0.08f, 0.08f, 0.08f);
    cubes[i].color = cube_colors[i];
  }

  // Manual depth buffering
  auto zrender = Render::ZRender(state.screen_width,state.screen_height);
  auto zprogram = glCreateProgram();
  auto zvertex  = CompileAndLogShader("./shader/zvertex.glsl",GL_VERTEX_SHADER);
  glAttachShader(zprogram,zvertex);
  zrender.attachDepthFragment(zprogram);
  
  
  const char* skybox_textures[6] = {
    "./resources/skybox/right.png",
    "./resources/skybox/left.png",
    "./resources/skybox/top.png",
    "./resources/skybox/bottom.png",
    "./resources/skybox/back.png",
    "./resources/skybox/front.png"
  };
  SkyBox skybox;
  skybox.load_skybox_textures(skybox_textures);
  glUseProgram(render.skybox_shader_program.shader_program);
  update_uniform_1i("skybox", render.skybox_shader_program.shader_program, 0);

  // glEnable(GL_DEPTH_TEST);

  //std::cout << "Width " << state.screen_width << " Height -> " << state.screen_height << std::endl;
  // pre-main loop optimization
  FMath::Mat4 model(1.0f), inverse_model(1.0f);
  model = model.translate({0.0f, 0.0f, 0.0f});
  model = model.scale({0.2f, 0.2f, 0.2});
  inverse_model = inverse_model.model_mat_inverse(model);
  inverse_model = inverse_model.transpose();

  // projection matrix does not change for us since it is only first person view
  FMath::Mat4 projection(1.0f);
  projection = projection.perspective(1.0f, 30.0f,0.01f,100.0f); // 30 degrees so 30.0f

  // auto project = glm::perspective(glm::radians(30.0f),1.0f,0.1f,10.0f);

  glEnable(GL_CULL_FACE);
  auto now = std::chrono::steady_clock::now();
  auto then = now;

  FMath::Vec3<float> atten_vec[9] =
    {
      FMath::Vec3(1.0f,0.44f,0.35f),
      FMath::Vec3(1.0f,0.44f,0.35f),
      FMath::Vec3(1.0f,0.44f,0.35f),
      FMath::Vec3(1.0f,0.44f,0.35f),
      FMath::Vec3(1.0f,0.44f,0.35f),
      
      FMath::Vec3(0.1f,0.1f,0.1f),
      FMath::Vec3(0.1f,0.1f,0.1f),
      FMath::Vec3(0.1f,0.1f,0.1f),
      FMath::Vec3(0.1f,0.1f,0.1f)
    };
      
  
  while (!glfwWindowShouldClose(render.window)) {


    zrender.clearBG(0.25f,0.25f,0.25f,1.0f);
    zrender.clearDepth();

    glUseProgram(render.shader_program.shader_program);
    FMath::Mat4 view(1.0f), cube_model(1.0f);

    view = state.camera.ViewMatrix();

    update_uniform_3f("viewPos", render.shader_program.shader_program,
                      state.camera.camera_pos);
    for (int i = 0; i < NR_LIGHT_CUBES; i++) {
      update_uniform_3f(
          std::string("light[" + std::to_string(i) + "].position").c_str(),
          render.shader_program.shader_program, cubes[i].position);

      update_uniform_3f(std::string("light[" + std::to_string(i) + "].ambient").c_str(), render.shader_program.shader_program,
                        ambient(cubes[i].color));
      update_uniform_3f(std::string("light[" + std::to_string(i) + "].diffuse").c_str(), render.shader_program.shader_program,
                        diffuse(cubes[i].color));
      update_uniform_3f(std::string("light[" + std::to_string(i) + "].specular").c_str(), render.shader_program.shader_program,
                        specular(cubes[i].color));

      // TODO: maybe use default values for this one? just an optimization thought
      // update_uniform_1f(std::string("light[" + std::to_string(i) + "].constantAtten").c_str(),
      //                   render.shader_program.shader_program, 1.0f);
      // update_uniform_1f(std::string("light[" + std::to_string(i) + "].linearAtten").c_str(),
      //                   render.shader_program.shader_program, 0.35f);
      // update_uniform_1f(std::string("light[" + std::to_string(i) + "].quadraticAtten").c_str(),
      //                   render.shader_program.shader_program, 0.44f);

      update_uniform_1f(std::string("light[" + std::to_string(i) + "].constantAtten").c_str(),
                        render.shader_program.shader_program, atten_vec[i].x);
      update_uniform_1f(std::string("light[" + std::to_string(i) + "].linearAtten").c_str(),
                        render.shader_program.shader_program, atten_vec[i].y);
      update_uniform_1f(std::string("light[" + std::to_string(i) + "].quadraticAtten").c_str(),
                        render.shader_program.shader_program, atten_vec[i].z);

    }


    glUseProgram(render.shader_program.shader_program);
    update_uniform_matrix_4f("model", render.shader_program.shader_program, &model[0][0]);
    update_uniform_matrix_4f("inv_model", render.shader_program.shader_program, &inverse_model[0][0]);
    update_uniform_matrix_4f("projection", render.shader_program.shader_program,projection.value_ptr());
    update_uniform_matrix_4f("view", render.shader_program.shader_program, &view[0][0]);

    
    glUseProgram(zprogram);
    update_uniform_matrix_4f("model", zprogram, model.value_ptr());
    update_uniform_matrix_4f("projection", zprogram, projection.value_ptr());//projection.value_ptr());
    update_uniform_matrix_4f("view", zprogram, view.value_ptr());
    
    


    glUseProgram(render.skybox_shader_program.shader_program);



    update_uniform_matrix_4f("projection", render.skybox_shader_program.shader_program, &projection[0][0]);
    update_uniform_matrix_4f("view", render.skybox_shader_program.shader_program, &view[0][0]);

    glBindFramebuffer(GL_FRAMEBUFFER,zrender.colorFBO);
    skybox.draw_skybox();
    
    glUseProgram(zprogram);

    zrender.clearDepth();
     
    // zrender.clearDepth();
    // // mainModel.draw_model(render.shader_program.shader_program);

    //  modal.draw_model(render.shader_program.shader_program,zprogram,zrender);
    mainModel.draw_model(render.shader_program.shader_program,zprogram,zrender);
    // update_uniform_matrix_4f("model", zprogram, model.scale({5.0f,1.0f,5.0f}).value_ptr());
    floorModel.draw_model(render.shader_program.shader_program,zprogram,zrender);
    // // // light cube render
    // // glUseProgram(render.light_cube_shader_program.shader_program);
    // // update_uniform_matrix_4f("projection", render.light_cube_shader_program.shader_program, &projection[0][0]);
    // // update_uniform_matrix_4f("view", render.light_cube_shader_program.shader_program, &view[0][0]);

    // // // TODO: use instanced cubes
    // // glBindVertexArray(cubes[0].VAO);
    // // for (int i = 0; i < NR_LIGHT_CUBES; i++){
    // //   cube_model = FMath::Mat4<float>(1.0f);
    // //   cube_model = cube_model.translate(cubes[i].position);
    // //   cube_model = cube_model.scale(cubes[i].scale);

    // //   update_uniform_3f("cubeColor", render.light_cube_shader_program.shader_program, cubes[i].color);
    // //   update_uniform_matrix_4f("model", render.light_cube_shader_program.shader_program, &cube_model[0][0]);
    // //   glDrawArrays(GL_TRIANGLES, 0, 36);
    // // }
    
    zrender.draw();

    handleEvents(render.window);
    now = std::chrono::steady_clock::now();
    //std::cout << "FPS is -> " << 1000.0f/std::chrono::duration_cast<std::chrono::milliseconds>(now-then).count() << std::endl;
    then = now;
    glfwPollEvents();
    glfwSwapBuffers(render.window);
  }

  glDeleteProgram(render.shader_program.shader_program);
  glDeleteProgram(render.light_cube_shader_program.shader_program);
  glDeleteProgram(render.skybox_shader_program.shader_program);
  Render::DestroyRenderer(&render);
  return 0;
}